

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O2

bool gl4cts::CopyImage::Utils::roundComponent
               (GLenum internal_format,GLenum component,GLdouble *value)

{
  byte bVar1;
  double dVar2;
  
  if (internal_format - 0x804f < 2) {
    bVar1 = 4;
    if (internal_format != 0x804f) {
      bVar1 = (internal_format == 0x8050) * '\x05';
    }
    dVar2 = exp2((double)bVar1);
    dVar2 = floor((dVar2 + -1.0) * *value + 0.5);
    *value = (double)((int)dVar2 << (component == 0x1904) + (internal_format == 0x804f));
  }
  return internal_format - 0x804f < 2;
}

Assistant:

inline bool Utils::roundComponent(GLenum internal_format, GLenum component, GLdouble& value)
{
	int exponent = (internal_format == GL_RGB4 ? 4 : (internal_format == GL_RGB5 ? 5 : 0));
	if (!exponent)
		return false; //Currently this only happens with GL_RGB4 and GL_RGB5 when stored as 565 type.

	int rounded_value = static_cast<int>(floor((pow(2, exponent) - 1) * value + 0.5));
	int multiplier	= (component == GL_GREEN ? 2 : 1);
	if (internal_format == GL_RGB4)
	{
		multiplier *= 2;
	}
	value = rounded_value * multiplier;
	return true;
}